

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O2

bool __thiscall sptk::ScalarOperation::AddTangentOperation(ScalarOperation *this)

{
  ModuleInterface *pMVar1;
  _func_int **pp_Var2;
  ModuleInterface *local_18;
  
  pMVar1 = (ModuleInterface *)operator_new(0x10);
  pp_Var2 = (_func_int **)operator_new(8);
  *pp_Var2 = (_func_int *)&PTR__OperationInterface_00116af0;
  pMVar1->_vptr_ModuleInterface = (_func_int **)&PTR__OperationPerformer_001164b0;
  pMVar1[1]._vptr_ModuleInterface = pp_Var2;
  local_18 = pMVar1;
  std::
  vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
  ::emplace_back<sptk::ScalarOperation::ModuleInterface*>
            ((vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
              *)&this->modules_,&local_18);
  return true;
}

Assistant:

bool ScalarOperation::AddTangentOperation() {
  modules_.push_back(new OperationPerformer(new Tangent()));
  return true;
}